

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O2

Pipeline * __thiscall
n_e_s::core::Mos6502::create_right_shift_instruction
          (Pipeline *__return_storage_ptr__,Mos6502 *this,Opcode opcode,bool shift_in_carry)

{
  MemoryAccess access;
  undefined1 local_88 [16];
  _Manager_type local_78;
  _Elt_pointer pfStack_70;
  
  access = get_memory_access(opcode.family);
  Pipeline::Pipeline(__return_storage_ptr__);
  create_addressing_steps((Pipeline *)local_88,this,opcode.address_mode,access);
  Pipeline::append(__return_storage_ptr__,(Pipeline *)local_88);
  std::
  deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ::~deque((deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
            *)(local_88 + 8));
  local_78 = (_Manager_type)0x0;
  pfStack_70 = (_Elt_pointer)0x0;
  local_88._0_8_ = (void *)0x0;
  local_88._8_8_ = (_Map_pointer)0x0;
  local_88._0_8_ = operator_new(0x18);
  *(Mos6502 **)local_88._0_8_ = this;
  *(long *)(local_88._0_8_ + 8) = opcode._0_8_;
  *(AddressMode *)(local_88._0_8_ + 0x10) = opcode.address_mode;
  *(bool *)(local_88._0_8_ + 0x14) = shift_in_carry;
  pfStack_70 = (_Elt_pointer)
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1086:17)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1086:17)>
             ::_M_manager;
  Pipeline::push(__return_storage_ptr__,(StepT *)local_88);
  std::_Function_base::~_Function_base((_Function_base *)local_88);
  return __return_storage_ptr__;
}

Assistant:

Pipeline Mos6502::create_right_shift_instruction(Opcode opcode,
        bool shift_in_carry) {
    const MemoryAccess memory_access = get_memory_access(opcode.family);
    Pipeline result;
    result.append(create_addressing_steps(opcode.address_mode, memory_access));

    result.push([this, opcode, shift_in_carry] {
        const uint8_t source_value =
                opcode.address_mode == AddressMode::Accumulator ? registers_->a
                                                                : tmp_;

        uint8_t shifted_value = source_value >> 1u;
        if (shift_in_carry) {
            const auto carry = registers_->p & C_FLAG
                                       ? static_cast<uint8_t>(0b1000'0000)
                                       : static_cast<uint8_t>(0x00);
            shifted_value |= carry;
        }
        set_carry(source_value & 0x01u);
        set_zero(shifted_value);
        set_negative(shifted_value);

        if (opcode.address_mode == AddressMode::Accumulator) {
            registers_->a = shifted_value;
        } else {
            mmu_->write_byte(effective_address_, shifted_value);
        }
    });
    return result;
}